

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O3

void server_communicate(int *file_descriptors,Arguments *args)

{
  FILE *__s;
  void *__ptr;
  size_t sVar1;
  int iVar2;
  Benchmarks bench;
  sigaction signal_action;
  Benchmarks local_f8;
  sigaction local_c8;
  
  __s = (FILE *)open_stream(file_descriptors,1);
  setup_server_signals(&local_c8);
  __ptr = malloc((long)args->size);
  setup_benchmarks(&local_f8);
  wait_for_signal(&local_c8);
  if (0 < args->count) {
    iVar2 = 0;
    do {
      local_f8.single_start = now();
      sVar1 = fwrite(__ptr,(long)args->size,1,__s);
      if (sVar1 == 0xffffffffffffffff) {
        throw("Error writing to pipe");
      }
      fflush(__s);
      notify_client();
      wait_for_signal(&local_c8);
      benchmark(&local_f8);
      iVar2 = iVar2 + 1;
    } while (iVar2 < args->count);
  }
  evaluate(&local_f8,args);
  close(file_descriptors[1]);
  free(__ptr);
  return;
}

Assistant:

void server_communicate(int file_descriptors[2], struct Arguments *args) {
	struct sigaction signal_action;
	struct Benchmarks bench;
	FILE *stream;
	void *buffer;
	int message;

	stream = open_stream(file_descriptors, 1);
	setup_server_signals(&signal_action);
	buffer = malloc(args->size);
	setup_benchmarks(&bench);

	wait_for_signal(&signal_action);

	for (message = 0; message < args->count; ++message) {
		bench.single_start = now();

		if (fwrite(buffer, args->size, 1, stream) == -1) {
			throw("Error writing to pipe");
		}
		// Send immediately
		fflush(stream);

		notify_client();
		wait_for_signal(&signal_action);
		benchmark(&bench);
	}

	evaluate(&bench, args);

	// Now close the write end too
	close(file_descriptors[1]);
	free(buffer);
}